

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall wasm::PassRunner::runPassOnFunction(PassRunner *this,Pass *pass,Function *func)

{
  string *__k;
  int iVar1;
  const_iterator cVar2;
  ostream *poVar3;
  AfterEffectFunctionChecker *this_00;
  size_t sVar4;
  char *pcVar5;
  __hashtable *__h;
  undefined4 uVar6;
  bool bVar7;
  Name name;
  undefined1 local_378 [392];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  stringstream bodyBefore;
  ostream local_1e0 [112];
  ios_base local_170 [264];
  char *local_68;
  long local_60;
  undefined4 local_44;
  long *local_40;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> instance;
  
  iVar1 = (*pass->_vptr_Pass[4])(pass);
  if ((char)iVar1 == '\0') {
    __assert_fail("pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x3d2,"void wasm::PassRunner::runPassOnFunction(Pass *, Function *)");
  }
  __k = &pass->name;
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->options).passesToSkip._M_h,__k);
  if (cVar2.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = getPassDebug();
    if ((iVar1 == 2) && ((this->options).validate == true)) {
      uVar6 = (undefined4)CONCAT71((int7)((ulong)__k >> 8),(pass->name)._M_string_length != 0);
    }
    else {
      uVar6 = 0;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1f0);
    local_44 = uVar6;
    if ((char)uVar6 != '\0') {
      poVar3 = std::operator<<(local_1e0,func->body);
      local_378[0] = (WasmValidator)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_378,1);
    }
    if (iVar1 == 0) {
      this_00 = (AfterEffectFunctionChecker *)0x0;
    }
    else {
      this_00 = (AfterEffectFunctionChecker *)operator_new(0x28);
      this_00->func = func;
      pcVar5 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
      (this_00->name).super_IString.str._M_len =
           (func->super_Importable).super_Named.name.super_IString.str._M_len;
      (this_00->name).super_IString.str._M_str = pcVar5;
      bVar7 = (func->stackIR)._M_t.
              super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
              .
              super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
              ._M_head_impl != (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0;
      this_00->beganWithStackIR = bVar7;
      if (bVar7) {
        sVar4 = FunctionHasher::hashFunction(func);
        this_00->originalFunctionHash = sVar4;
      }
    }
    (*pass->_vptr_Pass[5])(&local_40,pass);
    if ((PassRunner *)local_40[1] != this && (PassRunner *)local_40[1] != (PassRunner *)0x0) {
      __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                    ,0x1dc,"void wasm::Pass::setPassRunner(PassRunner *)");
    }
    local_40[1] = (long)this;
    (**(code **)(*local_40 + 0x18))(local_40,this->wasm,func);
    handleAfterEffects(this,pass,func);
    if (iVar1 != 0) {
      AfterEffectFunctionChecker::check(this_00);
    }
    if ((char)local_44 != '\0') {
      pcVar5 = (char *)0x0;
      bVar7 = WasmValidator::validate((WasmValidator *)local_378,func,this->wasm,0);
      if (!bVar7) {
        Fatal::Fatal((Fatal *)local_378);
        poVar3 = (ostream *)(local_378 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Last nested function-parallel pass (",0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(pass->name)._M_dataplus._M_p,(pass->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,") broke validation of function ",0x1f);
        name.super_IString.str._M_str = pcVar5;
        name.super_IString.str._M_len =
             (size_t)(func->super_Importable).super_Named.name.super_IString.str._M_str;
        wasm::operator<<((wasm *)poVar3,
                         (ostream *)
                         (func->super_Importable).super_Named.name.super_IString.str._M_len,name);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,". Here is the function body before:\n",0x24);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_68,local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\nAnd here it is now:\n",0x16);
        std::operator<<(poVar3,func->body);
        instance._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
        super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl._7_1_ = 10;
        Fatal::operator<<((Fatal *)local_378,
                          (char *)((long)&instance._M_t.
                                          super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                          .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl +
                                  7));
        std::__cxx11::string::~string((string *)&local_68);
        Fatal::~Fatal((Fatal *)local_378);
      }
    }
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
    if (this_00 != (AfterEffectFunctionChecker *)0x0) {
      operator_delete(this_00,0x28);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1f0);
    std::ios_base::~ios_base(local_170);
  }
  else {
    local_1f0 = &this->skippedPasses;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1f0,__k);
  }
  return;
}

Assistant:

void PassRunner::runPassOnFunction(Pass* pass, Function* func) {
  assert(pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    skippedPasses.insert(pass->name);
    return;
  }

  auto passDebug = getPassDebug();

  // Add extra validation logic in pass-debug mode 2. The main logic in
  // PassRunner::run will work at the module level, and here for a function-
  // parallel pass we can do the same at the function level: we can print the
  // function before the pass, run the pass on the function, and then if it
  // fails to validate we can show an error and print the state right before the
  // pass broke it.
  //
  // Skip nameless passes for this. Anything without a name is an internal
  // component of some larger pass, and information about it won't be very
  // useful - leave it to the entire module to fail validation in that case.
  bool extraFunctionValidation =
    passDebug == 2 && options.validate && !pass->name.empty();
  std::stringstream bodyBefore;
  if (extraFunctionValidation) {
    bodyBefore << *func->body << '\n';
  }

  std::unique_ptr<AfterEffectFunctionChecker> checker;
  if (passDebug) {
    checker = std::make_unique<AfterEffectFunctionChecker>(func);
  }

  // Function-parallel passes get a new instance per function
  auto instance = pass->create();
  instance->setPassRunner(this);
  instance->runOnFunction(wasm, func);
  handleAfterEffects(pass, func);

  if (passDebug) {
    checker->check();
  }

  if (extraFunctionValidation) {
    if (!WasmValidator().validate(func, *wasm, WasmValidator::Minimal)) {
      Fatal() << "Last nested function-parallel pass (" << pass->name
              << ") broke validation of function " << func->name
              << ". Here is the function body before:\n"
              << bodyBefore.str() << "\n\nAnd here it is now:\n"
              << *func->body << '\n';
    }
  }
}